

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall duckdb::UnnestInit(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  FunctionData *pFVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::UnnestGlobalState_*,_false> _Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  LogicalType *pLVar4;
  BoundUnnestExpression *this_01;
  pointer pBVar5;
  pointer pUVar6;
  pointer *__ptr;
  templated_unique_single_t bound_unnest;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::BoundUnnestExpression_*,_false> local_48;
  _Head_base<0UL,_duckdb::UnnestGlobalState_*,_false> local_40;
  LogicalType local_38;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  pFVar1 = (input->bind_data).ptr;
  local_40._M_head_impl = (UnnestGlobalState *)operator_new(0x20);
  ((local_40._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__UnnestGlobalState_02495608;
  ((local_40._M_head_impl)->select_list).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_40._M_head_impl)->select_list).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_40._M_head_impl)->select_list).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00._M_head_impl = (Expression *)operator_new(0x60);
  pLVar4 = (LogicalType *)(pFVar1 + 1);
  LogicalType::LogicalType(&local_38,pLVar4);
  BoundReferenceExpression::BoundReferenceExpression
            ((BoundReferenceExpression *)this_00._M_head_impl,&local_38,0);
  LogicalType::~LogicalType(&local_38);
  pLVar4 = ListType::GetChildType(pLVar4);
  this_01 = (BoundUnnestExpression *)operator_new(0x60);
  LogicalType::LogicalType(&local_38,pLVar4);
  BoundUnnestExpression::BoundUnnestExpression(this_01,&local_38);
  local_48._M_head_impl = this_01;
  LogicalType::~LogicalType(&local_38);
  pBVar5 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                         *)&local_48);
  _Var2._M_head_impl =
       (pBVar5->child).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar5->child).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  pUVar6 = unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>,_true>
                         *)&local_40);
  local_38._0_8_ = local_48._M_head_impl;
  local_48._M_head_impl = (BoundUnnestExpression *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&pUVar6->select_list,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_38);
  if ((BoundUnnestExpression *)local_38._0_8_ != (BoundUnnestExpression *)0x0) {
    (*(((Expression *)local_38._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (UnnestGlobalState *)0x0;
  *(UnnestGlobalState **)this = _Var3._M_head_impl;
  if (local_48._M_head_impl != (BoundUnnestExpression *)0x0) {
    (*((local_48._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  if (local_40._M_head_impl != (UnnestGlobalState *)0x0) {
    (*((local_40._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

static unique_ptr<GlobalTableFunctionState> UnnestInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<UnnestBindData>();
	auto result = make_uniq<UnnestGlobalState>();
	auto ref = make_uniq<BoundReferenceExpression>(bind_data.input_type, 0U);
	auto bound_unnest = make_uniq<BoundUnnestExpression>(ListType::GetChildType(bind_data.input_type));
	bound_unnest->child = std::move(ref);
	result->select_list.push_back(std::move(bound_unnest));
	return std::move(result);
}